

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_filename_cmp(u_char *s1,u_char *s2,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  sVar3 = 0;
  while( true ) {
    if (n == sVar3) {
      return 0;
    }
    uVar1 = (ulong)s1[sVar3];
    uVar2 = (ulong)s2[sVar3];
    if (s1[sVar3] != s2[sVar3]) break;
    sVar3 = sVar3 + 1;
    if (uVar1 == 0) {
      return 0;
    }
  }
  if (uVar1 != 0 && uVar2 != 0) {
    if (uVar1 == 0x2f) {
      uVar1 = 0;
    }
    if (uVar2 == 0x2f) {
      uVar2 = 0;
    }
  }
  return uVar1 - uVar2;
}

Assistant:

ngx_int_t
ngx_filename_cmp(u_char *s1, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    while (n) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

#if (NGX_HAVE_CASELESS_FILESYSTEM)
        c1 = tolower(c1);
        c2 = tolower(c2);
#endif

        if (c1 == c2) {

            if (c1) {
                n--;
                continue;
            }

            return 0;
        }

        /* we need '/' to be the lowest character */

        if (c1 == 0 || c2 == 0) {
            return c1 - c2;
        }

        c1 = (c1 == '/') ? 0 : c1;
        c2 = (c2 == '/') ? 0 : c2;

        return c1 - c2;
    }

    return 0;
}